

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error load_mac_face(FT_Library library,FT_Stream stream,FT_Long face_index,FT_Face *aface,
                      FT_Open_Args *args)

{
  uint local_34;
  FT_Error error;
  FT_Open_Args *args_local;
  FT_Face *aface_local;
  FT_Long face_index_local;
  FT_Stream stream_local;
  FT_Library library_local;
  
  local_34 = IsMacBinary(library,stream,face_index,aface);
  if ((local_34 & 0xff) == 2) {
    local_34 = IsMacResource(library,stream,0,face_index,aface);
  }
  if ((((local_34 & 0xff) == 2) || ((local_34 & 0xff) == 0x55)) && ((args->flags & 4) != 0)) {
    local_34 = load_face_in_embedded_rfork(library,stream,face_index,aface,args);
  }
  return local_34;
}

Assistant:

static FT_Error
  load_mac_face( FT_Library           library,
                 FT_Stream            stream,
                 FT_Long              face_index,
                 FT_Face             *aface,
                 const FT_Open_Args  *args )
  {
    FT_Error error;
    FT_UNUSED( args );


    error = IsMacBinary( library, stream, face_index, aface );
    if ( FT_ERR_EQ( error, Unknown_File_Format ) )
    {

#undef  FT_COMPONENT
#define FT_COMPONENT  raccess

#ifdef FT_DEBUG_LEVEL_TRACE
      FT_TRACE3(( "Try as dfont: " ));
      if ( !( args->flags & FT_OPEN_MEMORY ) )
        FT_TRACE3(( "%s ...", args->pathname ));
#endif

      error = IsMacResource( library, stream, 0, face_index, aface );

      FT_TRACE3(( "%s\n", error ? "failed" : "successful" ));

#undef  FT_COMPONENT
#define FT_COMPONENT  objs

    }

    if ( ( FT_ERR_EQ( error, Unknown_File_Format )      ||
           FT_ERR_EQ( error, Invalid_Stream_Operation ) ) &&
         ( args->flags & FT_OPEN_PATHNAME )               )
      error = load_face_in_embedded_rfork( library, stream,
                                           face_index, aface, args );
    return error;
  }